

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsXMLReader.cxx
# Opt level: O1

bool __thiscall kws::XMLReader::Open(XMLReader *this,char *filename)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  char *__s;
  
  std::ifstream::open((char *)this,(_Ios_Openmode)filename);
  uVar1 = *(uint *)(&this->field_0x20 + *(long *)(*(long *)this + -0x18));
  if ((uVar1 & 5) == 0) {
    std::istream::seekg((long)this,_S_beg);
    lVar3 = std::istream::tellg();
    std::istream::seekg((long)this,_S_beg);
    __s = (char *)operator_new__(lVar3 + 1);
    std::istream::read((char *)this,(long)__s);
    __s[lVar3] = '\0';
    pcVar2 = (char *)(this->m_Buffer)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->m_Buffer,0,pcVar2,(ulong)__s);
    std::__cxx11::string::resize((ulong)&this->m_Buffer,(char)lVar3);
    operator_delete__(__s);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool XMLReader::Open(const char* filename)
{
  // Open file for reading
  m_File.open(filename,std::ifstream::binary);
  if ( m_File.fail() )
    {
    return false;
    }

  m_File.seekg(0,std::ios::end);
  unsigned long fileSize = static_cast<unsigned long>(m_File.tellg());
  m_File.seekg(0,std::ios::beg);

  char* buf = new char[fileSize+1];
  m_File.read(buf,fileSize);
  buf[fileSize] = 0;
  m_Buffer = buf;
  m_Buffer.resize(fileSize);
  delete [] buf;

  return true;
}